

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O0

void __thiscall b_tree_node::b_tree_node(b_tree_node *this,pager *p,uint16_t min_degree,bool leaf)

{
  ushort uVar1;
  uint64_t uVar2;
  uint16_t *puVar3;
  int64_t *piVar4;
  pair<unsigned_char_*,_unsigned_char_*> pVar5;
  uchar *read_ptr;
  bool leaf_local;
  uint16_t min_degree_local;
  pager *p_local;
  b_tree_node *this_local;
  
  this->_p = p;
  uVar2 = pager::append_page(this->_p);
  this->_ofs_field = uVar2;
  pager::map_page_from(&this->_mm,this->_p,this->_ofs_field);
  this->_min_degree_field = (uint16_t *)0x0;
  this->_leaf_field = (uint16_t *)0x0;
  this->_num_keys_field = (uint16_t *)0x0;
  this->_keys_field = (int64_t *)0x0;
  this->_valid_keys_field = (uint8_t *)0x0;
  this->_vals_field = (int64_t *)0x0;
  this->_child_ofs_field = (int64_t *)0x0;
  pVar5 = r_memory_map::map(&this->_mm);
  puVar3 = (uint16_t *)pVar5.first;
  this->_min_degree_field = puVar3;
  *this->_min_degree_field = min_degree;
  this->_leaf_field = puVar3 + 1;
  *this->_leaf_field = (ushort)leaf;
  this->_num_keys_field = puVar3 + 2;
  *this->_num_keys_field = 0;
  puVar3 = puVar3 + 3;
  this->_keys_field = (int64_t *)puVar3;
  uVar1 = *this->_min_degree_field;
  this->_valid_keys_field = (uint8_t *)(puVar3 + (long)(int)((uint)uVar1 * 2 + -1) * 4);
  piVar4 = (int64_t *)
           ((long)(int)((uint)*this->_min_degree_field * 2 + -1) +
           (long)(puVar3 + (long)(int)((uint)uVar1 * 2 + -1) * 4));
  this->_vals_field = piVar4;
  this->_child_ofs_field = piVar4 + (int)((uint)*this->_min_degree_field * 2 + -1);
  return;
}

Assistant:

b_tree_node::b_tree_node(const pager& p, uint16_t min_degree, bool leaf) :
    _p(p),
    _ofs_field(_p.append_page()),
    _mm(_p.map_page_from(_ofs_field)),
    _min_degree_field(nullptr),
    _leaf_field(nullptr),
    _num_keys_field(nullptr),
    _keys_field(nullptr),
    _valid_keys_field(nullptr),
    _vals_field(nullptr),
    _child_ofs_field(nullptr)
{
    auto read_ptr = _mm.map().first;

    _min_degree_field = (uint16_t*)read_ptr;
    *(_min_degree_field) = min_degree;
    read_ptr += sizeof(uint16_t);

    _leaf_field = (uint16_t*)read_ptr;
    *(_leaf_field) = leaf ? 1 : 0;
    read_ptr += sizeof(uint16_t);

    _num_keys_field = (uint16_t*)read_ptr;
    *(_num_keys_field) = 0;
    read_ptr += sizeof(uint16_t);

    _keys_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _valid_keys_field = (uint8_t*)read_ptr;
    read_ptr += sizeof(uint8_t) * ((*_min_degree_field * 2) - 1);

    _vals_field = (int64_t*)read_ptr;
    read_ptr += sizeof(int64_t) * ((*_min_degree_field * 2) - 1);

    _child_ofs_field = (int64_t*)read_ptr;
}